

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O0

void __thiscall Assimp::FBX::LayeredTexture::fillTexture(LayeredTexture *this,Document *doc)

{
  Connection *pCVar1;
  uint64_t dest;
  Connection *pCVar2;
  const_reference ppCVar3;
  value_type local_d0;
  value_type local_90;
  Texture *tex;
  string local_80;
  Object *local_60;
  Object *ob;
  Connection *local_48;
  Connection *con;
  size_t i;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_20;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  Document *doc_local;
  LayeredTexture *this_local;
  
  conns = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)doc;
  doc_local = (Document *)this;
  dest = FBX::Object::ID(&this->super_Object);
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&i,doc,dest);
  local_20 = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&i;
  con = (Connection *)0x0;
  while( true ) {
    pCVar1 = con;
    pCVar2 = (Connection *)
             std::
             vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             ::size(local_20);
    if (pCVar2 <= pCVar1) break;
    ppCVar3 = std::
              vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ::at(local_20,(size_type)con);
    local_48 = *ppCVar3;
    local_60 = Connection::SourceObject(local_48);
    if (local_60 == (Object *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"failed to read source object for texture link, ignoring",
                 (allocator<char> *)((long)&tex + 7));
      Util::DOMWarning(&local_80,(this->super_Object).element);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tex + 7));
    }
    else {
      if (local_60 == (Object *)0x0) {
        local_d0 = (value_type)0x0;
      }
      else {
        local_d0 = (value_type)
                   __dynamic_cast(local_60,&FBX::Object::typeinfo,&FBX::Texture::typeinfo,0);
      }
      local_90 = local_d0;
      std::vector<const_Assimp::FBX::Texture_*,_std::allocator<const_Assimp::FBX::Texture_*>_>::
      push_back(&this->textures,&local_90);
    }
    con = (Connection *)((long)&con->insertionOrder + 1);
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)&i);
  return;
}

Assistant:

void LayeredTexture::fillTexture(const Document& doc)
{
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
    for(size_t i = 0; i < conns.size();++i)
    {
        const Connection* con = conns.at(i);

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for texture link, ignoring",&element);
            continue;
        }

        const Texture* const tex = dynamic_cast<const Texture*>(ob);

        textures.push_back(tex);
    }
}